

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstraintsGroup.cpp
# Opt level: O0

bool __thiscall
iDynTree::optimalcontrol::ConstraintsGroup::ConstraintsGroupPimpl::addConstraint
          (ConstraintsGroupPimpl *this,shared_ptr<iDynTree::optimalcontrol::Constraint> *constraint,
          TimeRange *timeRange)

{
  double dVar1;
  bool bVar2;
  uint uVar3;
  element_type *peVar4;
  size_t sVar5;
  size_type sVar6;
  element_type *peVar7;
  ostream *poVar8;
  string *psVar9;
  char *pcVar10;
  SparsityStructure *this_00;
  TimeRange *in_RDX;
  __shared_ptr *in_RSI;
  long in_RDI;
  SparsityStructure *other;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>,_false,_true>,_bool>
  pVar11;
  SparsityStructure newConstraintMixedHessianSparsity;
  SparsityStructure newConstraintControlHessianSparsity;
  SparsityStructure newConstraintStateHessianSparsity;
  SparsityStructure newConstraintControlJacobianSparsity;
  SparsityStructure newConstraintStateJacobianSparsity;
  ostringstream errorMsg_1;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>,_false,_true>,_bool>
  result;
  TimedConstraint_ptr newConstraint;
  ostringstream errorMsg;
  iterator constraintIterator;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>
  *in_stack_fffffffffffff8b8;
  undefined6 in_stack_fffffffffffff8c0;
  undefined1 in_stack_fffffffffffff8c6;
  undefined1 in_stack_fffffffffffff8c7;
  undefined1 in_stack_fffffffffffff8c8;
  undefined1 in_stack_fffffffffffff8c9;
  undefined1 in_stack_fffffffffffff8ca;
  undefined1 in_stack_fffffffffffff8cb;
  undefined1 in_stack_fffffffffffff8cc;
  undefined1 in_stack_fffffffffffff8cd;
  undefined1 in_stack_fffffffffffff8ce;
  undefined1 in_stack_fffffffffffff8cf;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>
  *in_stack_fffffffffffff8d0;
  TimeRange *in_stack_fffffffffffff8e0;
  TimeRange *in_stack_fffffffffffff8e8;
  undefined1 local_628 [104];
  undefined1 local_5c0 [104];
  undefined1 local_558 [104];
  undefined1 local_4f0 [104];
  undefined1 local_488 [112];
  shared_ptr<iDynTree::optimalcontrol::TimedConstraint> *local_418;
  shared_ptr<iDynTree::optimalcontrol::TimedConstraint> *local_410;
  int local_404;
  string local_400 [32];
  ostringstream local_3e0 [376];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>,_true>
  local_268;
  undefined1 local_260;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>,_false,_true>,_bool>
  local_228;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>,_false,_true>,_bool>
  local_218 [2];
  string local_1f8 [48];
  ostringstream local_1c8 [376];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>,_true>
  local_50;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>,_true>
  local_48;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>,_true>
  local_40 [4];
  TimeRange *local_20;
  byte local_1;
  
  local_20 = in_RDX;
  bVar2 = std::__shared_ptr::operator_cast_to_bool(in_RSI);
  if (!bVar2) {
    iDynTree::reportError("ConstraintsGroup","addConstraint","Empty constraint pointer.");
    local_1 = 0;
    goto LAB_0039f56b;
  }
  peVar4 = std::
           __shared_ptr_access<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x39e827);
  sVar5 = Constraint::constraintSize(peVar4);
  if (*(uint *)(in_RDI + 0x278) < sVar5) {
    iDynTree::reportError
              ("ConstraintsGroup","addConstraint",
               "The constraint dimension is greater than the maximum allowed by the group.");
    local_1 = 0;
    goto LAB_0039f56b;
  }
  TimeRange::AnyTime();
  bVar2 = TimeRange::operator==(in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e0);
  if (bVar2) {
    sVar6 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>
            ::size((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>
                    *)0x39e8ae);
    if (sVar6 != 0) {
      iDynTree::reportError
                ("ConstraintsGroup","addConstraint",
                 "Only one constraint is allowed in a group if the timeRange is AnyTime.");
      local_1 = 0;
      goto LAB_0039f56b;
    }
  }
  else {
    bVar2 = TimeRange::isValid(local_20);
    if (!bVar2) {
      iDynTree::reportError("ConstraintsGroup","addConstraint","Invalid timeRange.");
      local_1 = 0;
      goto LAB_0039f56b;
    }
  }
  sVar6 = std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>
          ::size((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>
                  *)0x39e924);
  if (sVar6 != 0) {
    std::__detail::
    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>,_false,_true>
    ::_Node_iterator((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>,_false,_true>
                      *)0x39e93b);
    peVar4 = std::
             __shared_ptr_access<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x39e948);
    Constraint::name_abi_cxx11_(peVar4);
    local_48._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>
         ::find(in_stack_fffffffffffff8b8,(key_type *)0x39e960);
    local_40[0]._M_cur = local_48._M_cur;
    local_50._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>
         ::end(in_stack_fffffffffffff8b8);
    bVar2 = std::__detail::operator!=(local_40,&local_50);
    if (bVar2) {
      std::__cxx11::ostringstream::ostringstream(local_1c8);
      poVar8 = std::operator<<((ostream *)local_1c8,"A constraint named ");
      peVar4 = std::
               __shared_ptr_access<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x39e9eb);
      psVar9 = Constraint::name_abi_cxx11_(peVar4);
      poVar8 = std::operator<<(poVar8,(string *)psVar9);
      poVar8 = std::operator<<(poVar8," already exists in the group ");
      poVar8 = std::operator<<(poVar8,(string *)(in_RDI + 600));
      std::operator<<(poVar8," .");
      std::__cxx11::ostringstream::str();
      pcVar10 = (char *)std::__cxx11::string::c_str();
      iDynTree::reportError("ConstraintsGroup","addConstraint",pcVar10);
      std::__cxx11::string::~string(local_1f8);
      local_1 = 0;
      std::__cxx11::ostringstream::~ostringstream(local_1c8);
      goto LAB_0039f56b;
    }
  }
  std::make_shared<iDynTree::optimalcontrol::TimedConstraint>();
  peVar7 = std::
           __shared_ptr_access<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x39eb56);
  (peVar7->timeRange).m_anyTime = local_20->m_anyTime;
  dVar1 = local_20->m_endTime;
  (peVar7->timeRange).m_initTime = local_20->m_initTime;
  (peVar7->timeRange).m_endTime = dVar1;
  std::
  __shared_ptr_access<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x39eb78);
  std::shared_ptr<iDynTree::optimalcontrol::Constraint>::operator=
            ((shared_ptr<iDynTree::optimalcontrol::Constraint> *)
             CONCAT17(in_stack_fffffffffffff8c7,
                      CONCAT16(in_stack_fffffffffffff8c6,in_stack_fffffffffffff8c0)),
             (shared_ptr<iDynTree::optimalcontrol::Constraint> *)in_stack_fffffffffffff8b8);
  peVar7 = std::
           __shared_ptr_access<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x39eb95);
  peVar4 = std::
           __shared_ptr_access<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x39ebae);
  Constraint::constraintSize(peVar4);
  iDynTree::VectorDynSize::resize((ulong)&peVar7->constraintBuffer);
  peVar7 = std::
           __shared_ptr_access<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x39ebe8);
  peVar4 = std::
           __shared_ptr_access<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x39ec01);
  sVar5 = Constraint::constraintSize(peVar4);
  peVar4 = std::
           __shared_ptr_access<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x39ec32);
  (*peVar4->_vptr_Constraint[6])();
  iDynTree::MatrixDynSize::resize((ulong)&peVar7->stateJacobianBuffer,sVar5 & 0xffffffff);
  peVar7 = std::
           __shared_ptr_access<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x39ec78);
  peVar4 = std::
           __shared_ptr_access<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x39ec91);
  sVar5 = Constraint::constraintSize(peVar4);
  peVar4 = std::
           __shared_ptr_access<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x39ecbf);
  (*peVar4->_vptr_Constraint[7])();
  iDynTree::MatrixDynSize::resize((ulong)&peVar7->controlJacobianBuffer,sVar5 & 0xffffffff);
  peVar7 = std::
           __shared_ptr_access<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x39ecfc);
  peVar4 = std::
           __shared_ptr_access<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x39ed14);
  Constraint::constraintSize(peVar4);
  iDynTree::VectorDynSize::resize((ulong)&peVar7->lambdaBuffer);
  std::
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>,_false,_true>,_bool>
  ::
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>,_false,_true>,_bool,_true>
            ((pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>,_false,_true>,_bool>
              *)CONCAT17(in_stack_fffffffffffff8c7,
                         CONCAT16(in_stack_fffffffffffff8c6,in_stack_fffffffffffff8c0)));
  peVar4 = std::
           __shared_ptr_access<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x39ed61);
  Constraint::name_abi_cxx11_(peVar4);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>
  ::pair<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_&,_true>
            (in_stack_fffffffffffff8d0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff8cf,
                      CONCAT16(in_stack_fffffffffffff8ce,
                               CONCAT15(in_stack_fffffffffffff8cd,
                                        CONCAT14(in_stack_fffffffffffff8cc,
                                                 CONCAT13(in_stack_fffffffffffff8cb,
                                                          CONCAT12(in_stack_fffffffffffff8ca,
                                                                   CONCAT11(
                                                  in_stack_fffffffffffff8c9,
                                                  in_stack_fffffffffffff8c8))))))),
             (shared_ptr<iDynTree::optimalcontrol::TimedConstraint> *)
             CONCAT17(in_stack_fffffffffffff8c7,
                      CONCAT16(in_stack_fffffffffffff8c6,in_stack_fffffffffffff8c0)));
  pVar11 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>
           ::insert((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>
                     *)in_stack_fffffffffffff8d0,
                    (value_type *)
                    CONCAT17(in_stack_fffffffffffff8cf,
                             CONCAT16(in_stack_fffffffffffff8ce,
                                      CONCAT15(in_stack_fffffffffffff8cd,
                                               CONCAT14(in_stack_fffffffffffff8cc,
                                                        CONCAT13(in_stack_fffffffffffff8cb,
                                                                 CONCAT12(in_stack_fffffffffffff8ca,
                                                                          CONCAT11(
                                                  in_stack_fffffffffffff8c9,
                                                  in_stack_fffffffffffff8c8))))))));
  local_268._M_cur =
       (__node_type *)
       pVar11.first.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>,_true>
       ._M_cur;
  local_260 = pVar11.second;
  local_228.first.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>,_true>
             )(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>,_true>
               )local_268._M_cur;
  local_228.second = (bool)local_260;
  std::
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>,_false,_true>,_bool>
  ::operator=(local_218,&local_228);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>
           *)CONCAT17(in_stack_fffffffffffff8c7,
                      CONCAT16(in_stack_fffffffffffff8c6,in_stack_fffffffffffff8c0)));
  if ((local_218[0].second & 1U) == 0) {
    std::__cxx11::ostringstream::ostringstream(local_3e0);
    poVar8 = std::operator<<((ostream *)local_3e0,"Unable to add constraint ");
    peVar4 = std::
             __shared_ptr_access<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x39ee46);
    psVar9 = Constraint::name_abi_cxx11_(peVar4);
    poVar8 = std::operator<<(poVar8,(string *)psVar9);
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    std::__cxx11::ostringstream::str();
    pcVar10 = (char *)std::__cxx11::string::c_str();
    iDynTree::reportError("ConstraintsGroup","addConstraint",pcVar10);
    std::__cxx11::string::~string(local_400);
    local_1 = 0;
    local_404 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_3e0);
  }
  else {
    this_00 = (SparsityStructure *)(in_RDI + 0x38);
    std::__detail::
    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>,_false,_true>
    ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>,_false,_true>
                  *)0x39ef92);
    std::
    vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>
    ::push_back((vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>
                 *)in_stack_fffffffffffff8d0,
                (value_type *)
                CONCAT17(in_stack_fffffffffffff8cf,
                         CONCAT16(in_stack_fffffffffffff8ce,
                                  CONCAT15(in_stack_fffffffffffff8cd,
                                           CONCAT14(in_stack_fffffffffffff8cc,
                                                    CONCAT13(in_stack_fffffffffffff8cb,
                                                             CONCAT12(in_stack_fffffffffffff8ca,
                                                                      CONCAT11(
                                                  in_stack_fffffffffffff8c9,
                                                  in_stack_fffffffffffff8c8))))))));
    other = (SparsityStructure *)(in_RDI + 0x38);
    local_410 = (shared_ptr<iDynTree::optimalcontrol::TimedConstraint> *)
                std::
                vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>
                ::begin((vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>
                         *)in_stack_fffffffffffff8b8);
    local_418 = (shared_ptr<iDynTree::optimalcontrol::TimedConstraint> *)
                std::
                vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>
                ::end((vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>
                       *)in_stack_fffffffffffff8b8);
    std::
    sort<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>*,std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>>>>,iDynTree::optimalcontrol::ConstraintsGroup::ConstraintsGroupPimpl::addConstraint(std::shared_ptr<iDynTree::optimalcontrol::Constraint>,iDynTree::optimalcontrol::TimeRange_const&)::_lambda(std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>const&,std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>const&)_1_>
              (local_410,local_418);
    SparsityStructure::SparsityStructure
              ((SparsityStructure *)
               CONCAT17(in_stack_fffffffffffff8c7,
                        CONCAT16(in_stack_fffffffffffff8c6,in_stack_fffffffffffff8c0)));
    SparsityStructure::SparsityStructure
              ((SparsityStructure *)
               CONCAT17(in_stack_fffffffffffff8c7,
                        CONCAT16(in_stack_fffffffffffff8c6,in_stack_fffffffffffff8c0)));
    if ((*(byte *)(in_RDI + 0x299) & 1) == 0) {
LAB_0039f100:
      *(undefined1 *)(in_RDI + 0x299) = 0;
LAB_0039f10f:
      if ((*(byte *)(in_RDI + 0x29a) & 1) == 0) {
LAB_0039f1c3:
        *(undefined1 *)(in_RDI + 0x29a) = 0;
      }
      else {
        peVar4 = std::
                 __shared_ptr_access<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x39f131);
        uVar3 = (*peVar4->_vptr_Constraint[9])(peVar4,local_4f0);
        if ((uVar3 & 1) == 0) goto LAB_0039f1c3;
        bVar2 = SparsityStructure::isValid
                          ((SparsityStructure *)
                           CONCAT17(in_stack_fffffffffffff8c7,
                                    CONCAT16(in_stack_fffffffffffff8c6,in_stack_fffffffffffff8c0)));
        if (!bVar2) {
          iDynTree::reportError
                    ("ConstraintsGroup","addConstraint",
                     "The control sparsity is provided but the dimension of the two vectors do not match."
                    );
          local_1 = 0;
          local_404 = 1;
          goto LAB_0039f1dd;
        }
        SparsityStructure::merge(this_00,other);
      }
      local_404 = 0;
    }
    else {
      peVar4 = std::
               __shared_ptr_access<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x39f02c);
      uVar3 = (*peVar4->_vptr_Constraint[8])(peVar4,local_488);
      if ((uVar3 & 1) == 0) goto LAB_0039f100;
      bVar2 = SparsityStructure::isValid
                        ((SparsityStructure *)
                         CONCAT17(in_stack_fffffffffffff8c7,
                                  CONCAT16(in_stack_fffffffffffff8c6,in_stack_fffffffffffff8c0)));
      if (bVar2) {
        SparsityStructure::merge(this_00,other);
        goto LAB_0039f10f;
      }
      iDynTree::reportError
                ("ConstraintsGroup","addConstraint",
                 "The state sparsity is provided but the dimension of the two vectors do not match."
                );
      local_1 = 0;
      local_404 = 1;
    }
LAB_0039f1dd:
    SparsityStructure::~SparsityStructure
              ((SparsityStructure *)
               CONCAT17(in_stack_fffffffffffff8c7,
                        CONCAT16(in_stack_fffffffffffff8c6,in_stack_fffffffffffff8c0)));
    SparsityStructure::~SparsityStructure
              ((SparsityStructure *)
               CONCAT17(in_stack_fffffffffffff8c7,
                        CONCAT16(in_stack_fffffffffffff8c6,in_stack_fffffffffffff8c0)));
    if (local_404 == 0) {
      SparsityStructure::SparsityStructure
                ((SparsityStructure *)
                 CONCAT17(in_stack_fffffffffffff8c7,
                          CONCAT16(in_stack_fffffffffffff8c6,in_stack_fffffffffffff8c0)));
      SparsityStructure::SparsityStructure
                ((SparsityStructure *)
                 CONCAT17(in_stack_fffffffffffff8c7,
                          CONCAT16(in_stack_fffffffffffff8c6,in_stack_fffffffffffff8c0)));
      SparsityStructure::SparsityStructure
                ((SparsityStructure *)
                 CONCAT17(in_stack_fffffffffffff8c7,
                          CONCAT16(in_stack_fffffffffffff8c6,in_stack_fffffffffffff8c0)));
      if ((*(byte *)(in_RDI + 0x29b) & 1) == 0) {
LAB_0039f35d:
        *(undefined1 *)(in_RDI + 0x29b) = 0;
LAB_0039f36c:
        if ((*(byte *)(in_RDI + 0x29c) & 1) == 0) {
LAB_0039f423:
          *(undefined1 *)(in_RDI + 0x29c) = 0;
        }
        else {
          peVar4 = std::
                   __shared_ptr_access<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x39f38e);
          uVar3 = (*peVar4->_vptr_Constraint[0xf])(peVar4,local_5c0);
          if ((uVar3 & 1) == 0) goto LAB_0039f423;
          bVar2 = SparsityStructure::isValid
                            ((SparsityStructure *)
                             CONCAT17(in_stack_fffffffffffff8c7,
                                      CONCAT16(in_stack_fffffffffffff8c6,in_stack_fffffffffffff8c0))
                            );
          if (!bVar2) {
            iDynTree::reportError
                      ("ConstraintsGroup","addConstraint",
                       "The control hessian sparsity is provided but the dimension of the two vectors do not match."
                      );
            local_1 = 0;
            goto LAB_0039f508;
          }
          SparsityStructure::merge(this_00,other);
        }
        if ((*(byte *)(in_RDI + 0x29d) & 1) == 0) {
LAB_0039f4e6:
          *(undefined1 *)(in_RDI + 0x29d) = 0;
        }
        else {
          peVar4 = std::
                   __shared_ptr_access<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x39f454);
          uVar3 = (*peVar4->_vptr_Constraint[0xe])(peVar4,local_628);
          in_stack_fffffffffffff8c7 = (undefined1)uVar3;
          if ((uVar3 & 1) == 0) goto LAB_0039f4e6;
          in_stack_fffffffffffff8c6 =
               SparsityStructure::isValid
                         ((SparsityStructure *)
                          CONCAT17(in_stack_fffffffffffff8c7,
                                   CONCAT16(in_stack_fffffffffffff8c6,in_stack_fffffffffffff8c0)));
          if (!(bool)in_stack_fffffffffffff8c6) {
            iDynTree::reportError
                      ("ConstraintsGroup","addConstraint",
                       "The state control hessian sparsity is provided but the dimension of the two vectors do not match."
                      );
            local_1 = 0;
            goto LAB_0039f508;
          }
          SparsityStructure::merge(this_00,other);
        }
        local_1 = 1;
      }
      else {
        peVar4 = std::
                 __shared_ptr_access<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x39f257);
        uVar3 = (*peVar4->_vptr_Constraint[0xd])(peVar4,local_558);
        if ((uVar3 & 1) == 0) goto LAB_0039f35d;
        bVar2 = SparsityStructure::isValid
                          ((SparsityStructure *)
                           CONCAT17(in_stack_fffffffffffff8c7,
                                    CONCAT16(in_stack_fffffffffffff8c6,in_stack_fffffffffffff8c0)));
        if (bVar2) {
          SparsityStructure::merge(this_00,other);
          goto LAB_0039f36c;
        }
        iDynTree::reportError
                  ("ConstraintsGroup","addConstraint",
                   "The state hessian sparsity is provided but the dimension of the two vectors do not match."
                  );
        local_1 = 0;
      }
LAB_0039f508:
      local_404 = 1;
      SparsityStructure::~SparsityStructure
                ((SparsityStructure *)
                 CONCAT17(in_stack_fffffffffffff8c7,
                          CONCAT16(in_stack_fffffffffffff8c6,in_stack_fffffffffffff8c0)));
      SparsityStructure::~SparsityStructure
                ((SparsityStructure *)
                 CONCAT17(in_stack_fffffffffffff8c7,
                          CONCAT16(in_stack_fffffffffffff8c6,in_stack_fffffffffffff8c0)));
      SparsityStructure::~SparsityStructure
                ((SparsityStructure *)
                 CONCAT17(in_stack_fffffffffffff8c7,
                          CONCAT16(in_stack_fffffffffffff8c6,in_stack_fffffffffffff8c0)));
    }
  }
  std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>::~shared_ptr
            ((shared_ptr<iDynTree::optimalcontrol::TimedConstraint> *)0x39f55a);
LAB_0039f56b:
  return (bool)(local_1 & 1);
}

Assistant:

bool addConstraint(std::shared_ptr<Constraint> constraint, const TimeRange &timeRange)
            {
                if (!constraint){
                    reportError("ConstraintsGroup", "addConstraint", "Empty constraint pointer.");
                    return false;
                }

                if (constraint->constraintSize() > maxConstraintSize){
                    reportError("ConstraintsGroup", "addConstraint", "The constraint dimension is greater than the maximum allowed by the group.");
                    return false;
                }

                if (timeRange == TimeRange::AnyTime()){
                    if (group.size() != 0){
                        reportError("ConstraintsGroup", "addConstraint",
                                    "Only one constraint is allowed in a group if the timeRange is AnyTime.");
                        return false;
                    }
                } else {
                    if (!timeRange.isValid()){
                        reportError("ConstraintsGroup", "addConstraint", "Invalid timeRange.");
                        return false;
                    }
                }

                if(group.size() > 0){
                    GroupOfConstraintsMap::iterator constraintIterator;
                    constraintIterator = group.find(constraint->name());
                    if(constraintIterator != group.end()){
                        std::ostringstream errorMsg;
                        errorMsg << "A constraint named " << constraint->name()
                                 <<" already exists in the group "<< name << " .";
                        reportError("ConstraintsGroup", "addConstraint", errorMsg.str().c_str());
                        return false;
                    }
                }

                //add constraints in the group
                TimedConstraint_ptr newConstraint = std::make_shared<TimedConstraint>();

                newConstraint->timeRange = timeRange;
                newConstraint->constraint = constraint;
                newConstraint->constraintBuffer.resize(static_cast<unsigned int>(constraint->constraintSize()));
                newConstraint->stateJacobianBuffer.resize(static_cast<unsigned int>(constraint->constraintSize()), static_cast<unsigned int>(constraint->expectedStateSpaceSize()));
                newConstraint->controlJacobianBuffer.resize(static_cast<unsigned int>(constraint->constraintSize()), static_cast<unsigned int>(constraint->expectedControlSpaceSize()));
                newConstraint->lambdaBuffer.resize(static_cast<unsigned int>(constraint->constraintSize()));


                std::pair< GroupOfConstraintsMap::iterator, bool> result;
                result = group.insert(GroupOfConstraintsMap::value_type(constraint->name(), newConstraint));

                if(!result.second){
                    std::ostringstream errorMsg;
                    errorMsg << "Unable to add constraint "<<constraint->name() << std::endl;
                    reportError("ConstraintsGroup", "addConstraint", errorMsg.str().c_str());
                    return false;
                }

                orderedIntervals.push_back(result.first->second); //register the time range in order to have the constraints ordered by init time. result.first->second is the TimedConstraint_ptr of the newly inserted TimedConstraint.
                std::sort(orderedIntervals.begin(), orderedIntervals.end(), [](const TimedConstraint_ptr&a, const TimedConstraint_ptr&b) { return a->timeRange < b->timeRange;}); //reorder the vector

                {
                    SparsityStructure newConstraintStateJacobianSparsity, newConstraintControlJacobianSparsity;

                    if (stateJacobianSparsityProvided
                        && constraint->constraintJacobianWRTStateSparsity(newConstraintStateJacobianSparsity)) {

                        if (!newConstraintStateJacobianSparsity.isValid()) {
                            reportError("ConstraintsGroup", "addConstraint", "The state sparsity is provided but the dimension of the two vectors do not match.");
                            return false;
                        }

                        groupStateJacobianSparsity.merge(newConstraintStateJacobianSparsity);

                    } else {
                        stateJacobianSparsityProvided = false;
                    }

                    if (controlJacobianSparsityProvided
                        && constraint->constraintJacobianWRTControlSparsity(newConstraintControlJacobianSparsity)) {

                        if (!newConstraintControlJacobianSparsity.isValid()) {
                            reportError("ConstraintsGroup", "addConstraint", "The control sparsity is provided but the dimension of the two vectors do not match.");
                            return false;
                        }

                        groupControlJacobianSparsity.merge(newConstraintControlJacobianSparsity);

                    } else {
                        controlJacobianSparsityProvided = false;
                    }
                }

                SparsityStructure newConstraintStateHessianSparsity, newConstraintControlHessianSparsity, newConstraintMixedHessianSparsity;

                if (stateHessianSparsityProvided
                    && constraint->constraintSecondPartialDerivativeWRTStateSparsity(newConstraintStateHessianSparsity)) {

                    if (!newConstraintStateHessianSparsity.isValid()) {
                        reportError("ConstraintsGroup", "addConstraint", "The state hessian sparsity is provided but the dimension of the two vectors do not match.");
                        return false;
                    }

                    groupStateHessianSparsity.merge(newConstraintStateHessianSparsity);

                } else {
                    stateHessianSparsityProvided = false;
                }

                if (controlHessianSparsityProvided
                    && constraint->constraintSecondPartialDerivativeWRTControlSparsity(newConstraintControlHessianSparsity)) {

                    if (!newConstraintControlHessianSparsity.isValid()) {
                        reportError("ConstraintsGroup", "addConstraint", "The control hessian sparsity is provided but the dimension of the two vectors do not match.");
                        return false;
                    }

                    groupControlHessianSparsity.merge(newConstraintControlHessianSparsity);

                } else {
                    controlHessianSparsityProvided = false;
                }

                if (mixedHessianSparsityProvided
                    && constraint->constraintSecondPartialDerivativeWRTStateControlSparsity(newConstraintMixedHessianSparsity)) {

                    if (!newConstraintMixedHessianSparsity.isValid()) {
                        reportError("ConstraintsGroup", "addConstraint", "The state control hessian sparsity is provided but the dimension of the two vectors do not match.");
                        return false;
                    }

                    groupMixedHessianSparsity.merge(newConstraintMixedHessianSparsity);

                } else {
                    mixedHessianSparsityProvided = false;
                }

                return true;
            }